

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::ExpressionsIndexingScalar1<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsIndexingScalar1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  long *plVar1;
  ulong *puVar2;
  undefined1 *puVar3;
  TestError *pTVar4;
  long lVar5;
  long *plVar6;
  size_type *psVar7;
  undefined1 *puVar8;
  long lVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  long lVar12;
  undefined1 *puVar13;
  string *psVar14;
  long lVar15;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string shader_source;
  
  lVar15 = 0;
  lVar12 = 0x2238c78;
  do {
    lVar5 = lVar12;
    if (supported_variable_types_map._16_8_ != 0) {
      lVar9 = supported_variable_types_map._16_8_;
      do {
        if (*(int *)(Interface::GL::var_types + lVar15 * 4) <= *(int *)(lVar9 + 0x20)) {
          lVar5 = lVar9;
        }
        lVar9 = *(long *)(lVar9 + 0x10 +
                         (ulong)(*(int *)(lVar9 + 0x20) <
                                *(int *)(Interface::GL::var_types + lVar15 * 4)) * 8);
      } while (lVar9 != 0);
    }
    lVar9 = lVar12;
    if ((lVar5 != 0x2238c78) &&
       (lVar9 = lVar5, *(int *)(Interface::GL::var_types + lVar15 * 4) < *(int *)(lVar5 + 0x20))) {
      lVar9 = lVar12;
    }
    if (lVar9 == 0x2238c78) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,3000);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str,shader_start_abi_cxx11_,DAT_02233658 + shader_start_abi_cxx11_);
    std::__cxx11::string::append((char *)&__str);
    plVar1 = (long *)std::__cxx11::string::_M_append((char *)&__str,*(ulong *)(lVar9 + 0x28));
    plVar6 = plVar1 + 2;
    if ((long *)*plVar1 == plVar6) {
      local_88 = *plVar6;
      lStack_80 = plVar1[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar6;
      local_98 = (long *)*plVar1;
    }
    local_90 = plVar1[1];
    *plVar1 = (long)plVar6;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_98);
    shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
    psVar7 = (size_type *)(plVar1 + 2);
    if ((size_type *)*plVar1 == psVar7) {
      shader_source.field_2._M_allocated_capacity = *psVar7;
      shader_source.field_2._8_8_ = plVar1[3];
    }
    else {
      shader_source.field_2._M_allocated_capacity = *psVar7;
      shader_source._M_dataplus._M_p = (pointer)*plVar1;
    }
    shader_source._M_string_length = plVar1[1];
    *plVar1 = (long)psVar7;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&shader_source);
    std::__cxx11::string::append((char *)&shader_source);
    std::__cxx11::string::append((char *)&shader_source);
    std::operator+(&__str,"                x[0][i][j][k] = ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (lVar9 + 0x68));
    plVar1 = (long *)std::__cxx11::string::append((char *)&__str);
    plVar6 = plVar1 + 2;
    if ((long *)*plVar1 == plVar6) {
      local_88 = *plVar6;
      lStack_80 = plVar1[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar6;
      local_98 = (long *)*plVar1;
    }
    local_90 = plVar1[1];
    *plVar1 = (long)plVar6;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_98);
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&shader_source);
    std::__cxx11::string::append((char *)&shader_source);
    std::__cxx11::string::append((char *)&shader_source);
    if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xbb1);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    puVar2 = &set_tesseation_abi_cxx11_;
    switch(tested_shader_type) {
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::append((char *)&shader_source);
      break;
    case GEOMETRY_SHADER_TYPE:
      puVar2 = &emit_quad_abi_cxx11_;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::_M_append((char *)&shader_source,*puVar2);
    }
    std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
    puVar11 = empty_string_abi_cxx11_;
    puVar10 = empty_string_abi_cxx11_;
    puVar8 = empty_string_abi_cxx11_;
    puVar13 = empty_string_abi_cxx11_;
    puVar3 = (undefined1 *)&shader_source;
    psVar14 = (string *)empty_string_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      puVar3 = empty_string_abi_cxx11_;
      puVar11 = default_vertex_shader_source_abi_cxx11_;
      puVar10 = default_tc_shader_source_abi_cxx11_;
      puVar8 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
      puVar13 = default_geometry_shader_source_abi_cxx11_;
      psVar14 = &shader_source;
      break;
    case VERTEX_SHADER_TYPE:
      puVar10 = default_tc_shader_source_abi_cxx11_;
      puVar11 = (undefined1 *)&shader_source;
      goto LAB_00b67ffb;
    case COMPUTE_SHADER_TYPE:
      break;
    case GEOMETRY_SHADER_TYPE:
      puVar11 = default_vertex_shader_source_abi_cxx11_;
      puVar10 = default_tc_shader_source_abi_cxx11_;
      puVar8 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
      puVar13 = (undefined1 *)&shader_source;
      goto LAB_00b6803c;
    case TESSELATION_CONTROL_SHADER_TYPE:
      puVar10 = (undefined1 *)&shader_source;
      puVar11 = default_vertex_shader_source_abi_cxx11_;
LAB_00b67ffb:
      puVar8 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
LAB_00b68035:
      puVar13 = default_geometry_shader_source_abi_cxx11_;
LAB_00b6803c:
      puVar3 = empty_string_abi_cxx11_;
      psVar14 = (string *)default_fragment_shader_source_abi_cxx11_;
      break;
    case TESSELATION_EVALUATION_SHADER_TYPE:
      puVar11 = default_vertex_shader_source_abi_cxx11_;
      puVar10 = default_tc_shader_source_abi_cxx11_;
      puVar8 = (undefined1 *)&shader_source;
      goto LAB_00b68035;
    default:
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xbb4);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[10])(this,puVar11,puVar10,puVar8,puVar13,psVar14,puVar3,1,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
      operator_delete(shader_source._M_dataplus._M_p,shader_source.field_2._M_allocated_capacity + 1
                     );
    }
    lVar15 = lVar15 + 1;
    if (lVar15 == 0x29) {
      return;
    }
  } while( true );
}

Assistant:

void ExpressionsIndexingScalar1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	for (size_t var_type_index = 0; var_type_index < API::n_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(API::var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string shader_source = shader_start + "    " + var_iterator->second.type + " x[1][2][3][4];\n\n";

			shader_source += "    for (uint i = 0u; i < 2u; i++) {\n";
			shader_source += "        for (uint j = 0u; j < 3u; j++) {\n";
			shader_source += "            for (uint k = 0u; k < 4u; k++) {\n";
			shader_source += "                x[0][i][j][k] = " + var_iterator->second.initializer_with_ones + ";\n";
			shader_source += "            }\n";
			shader_source += "        }\n";
			shader_source += "    }\n";

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	}
}